

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  undefined1 local_138 [8];
  string_view metadata_name;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_120;
  size_t local_110;
  char *local_108;
  Enum local_fc;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f8;
  size_t local_e8;
  char *local_e0;
  Enum local_d8;
  Enum local_d4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d0;
  size_t local_c0;
  char *local_b8;
  Enum local_ac;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  size_t local_98;
  char *local_90;
  undefined4 local_88;
  Enum local_84;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  size_t local_70;
  char *local_68;
  undefined1 local_60 [8];
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_> guard
  ;
  undefined1 local_38 [8];
  string_view section_name;
  Offset section_size_local;
  Index section_index_local;
  BinaryReader *this_local;
  
  section_name._M_str = (char *)section_size;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  RVar2 = ReadStr(this,(string_view *)local_38,"section name");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  guard._8_8_ = local_38;
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                          (this->delegate_,(ulong)section_index,section_name._M_str,local_38,
                           section_name._M_len);
  bVar1 = Succeeded(RVar2);
  if (!bVar1) {
    PrintError(this,"BeginCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                     *)local_60,this);
  this->reading_custom_section_ = true;
  if ((this->options_->read_debug_names & 1U) == 0) {
LAB_001401b0:
    local_98 = (size_t)local_38;
    local_90 = (char *)section_name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"dylink.0");
    __x_02._M_str = local_90;
    __x_02._M_len = local_98;
    bVar1 = std::operator==(__x_02,local_a8);
    if (bVar1) {
      local_ac = (Enum)ReadDylink0Section(this,(Offset)section_name._M_str);
      bVar1 = Failed((Result)local_ac);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_001405dc;
      }
    }
    else {
      local_c0 = (size_t)local_38;
      local_b8 = (char *)section_name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"dylink");
      __x_01._M_str = local_b8;
      __x_01._M_len = local_c0;
      bVar1 = std::operator==(__x_01,local_d0);
      if (bVar1) {
        local_d4 = (Enum)ReadDylinkSection(this,(Offset)section_name._M_str);
        bVar1 = Failed((Result)local_d4);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          goto LAB_001405dc;
        }
      }
      else {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_38,"reloc",0);
        if (sVar3 == 0) {
          local_d8 = (Enum)ReadRelocSection(this,(Offset)section_name._M_str);
          bVar1 = Failed((Result)local_d8);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            goto LAB_001405dc;
          }
        }
        else {
          local_e8 = (size_t)local_38;
          local_e0 = (char *)section_name._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_f8,"target_features");
          __x_00._M_str = local_e0;
          __x_00._M_len = local_e8;
          bVar1 = std::operator==(__x_00,local_f8);
          if (bVar1) {
            local_fc = (Enum)ReadTargetFeaturesSections(this,(Offset)section_name._M_str);
            bVar1 = Failed((Result)local_fc);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_001405dc;
            }
          }
          else {
            local_110 = (size_t)local_38;
            local_108 = (char *)section_name._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_120,"linking");
            __x._M_str = local_108;
            __x._M_len = local_110;
            bVar1 = std::operator==(__x,local_120);
            if (bVar1) {
              metadata_name._M_str._4_4_ = ReadLinkingSection(this,(Offset)section_name._M_str);
              bVar1 = Failed(metadata_name._M_str._4_4_);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                goto LAB_001405dc;
              }
            }
            else {
              bVar1 = Features::code_metadata_enabled(&this->options_->features);
              if ((bVar1) &&
                 (sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38,
                                     "metadata.code.",0), sVar3 == 0)) {
                local_138 = local_38;
                metadata_name._M_len = section_name._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_138,0xe);
                name._M_str = (char *)metadata_name._M_len;
                name._M_len = (size_t)local_138;
                RVar2 = ReadCodeMetadataSection(this,name,(Offset)section_name._M_str);
                bVar1 = Failed(RVar2);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  goto LAB_001405dc;
                }
              }
              else {
                (this->state_).offset = this->read_end_;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_70 = (size_t)local_38;
    local_68 = (char *)section_name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"name");
    __x_03._M_str = local_68;
    __x_03._M_len = local_70;
    bVar1 = std::operator==(__x_03,local_80);
    if (!bVar1) goto LAB_001401b0;
    local_84 = (Enum)ReadNameSection(this,(Offset)section_name._M_str);
    bVar1 = Failed((Result)local_84);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_001405dc;
    }
    this->did_read_names_section_ = true;
  }
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
  bVar1 = Succeeded(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"EndCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
LAB_001405dc:
  local_88 = 1;
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ~ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                      *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // This is an unknown custom section, skip it.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}